

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP2Frame.cpp
# Opt level: O3

string * __thiscall
HTTP2Frame::debugFrame_abi_cxx11_(string *__return_storage_ptr__,HTTP2Frame *this,char *frame)

{
  ulong uVar1;
  stringstream ss;
  stringstream local_1b0 [16];
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (this->length != 0xfffffff7) {
    uVar1 = 0;
    do {
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->length + 9);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string HTTP2Frame::debugFrame(char *frame) {
  
  std::stringstream ss;
  for(unsigned int i=0; i<length+9; ++i) {
      ss << std::hex << (unsigned int)frame[i];
    }
  return ss.str();
}